

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

uint64_t lj_carith_check64(lua_State *L,int narg,CTypeID *id)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  CType *d;
  uint *puVar4;
  CTState *pCVar5;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  uint64_t x;
  CType *s;
  CTypeID sid;
  uint8_t *sp;
  CTState *cts;
  TValue *o;
  CTState *cts_1;
  CType *ct;
  TValue o_1;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  lua_State *in_stack_fffffffffffffec0;
  uint local_134;
  CTState *pCVar6;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  CTState *in_stack_ffffffffffffff60;
  
  lVar2 = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  pdVar3 = (double *)(lVar2 + -8);
  if (pdVar3 < *(double **)(in_RDI + 0x18)) {
    if (0xfffeffff < *(uint *)(lVar2 + -4)) {
      if (*(int *)(lVar2 + -4) == -0xb) {
        d = (CType *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x194);
        d[1].info = (int)in_RDI;
        d[1].size = (int)((ulong)in_RDI >> 0x20);
        local_134 = (uint)*(ushort *)((ulong)*(uint *)pdVar3 + 6);
        puVar4 = (uint *)(*(long *)d + (ulong)local_134 * 0x10);
        if ((*puVar4 & 0xf0800000) == 0x20800000) {
          local_134 = *puVar4 & 0xffff;
        }
        pCVar5 = (CTState *)(*(long *)d + (ulong)local_134 * 0x10);
        while (pCVar6 = pCVar5, *(uint *)&pCVar6->tab >> 0x1c == 8) {
          in_stack_ffffffffffffff60 = pCVar6;
          pCVar5 = (CTState *)(*(long *)d + (ulong)(*(uint *)&pCVar6->tab & 0xffff) * 0x10);
        }
        pCVar5 = pCVar6;
        if (*(uint *)&pCVar6->tab >> 0x1c == 5) {
          pCVar5 = (CTState *)(*(long *)d + (ulong)(*(uint *)&pCVar6->tab & 0xffff) * 0x10);
        }
        if ((((ulong)pCVar5->tab & 0xfc800000) == 0x800000) &&
           (*(int *)((long)&pCVar5->tab + 4) == 8)) {
          *in_RDX = 0xc;
        }
        else if (*in_RDX == 0) {
          *in_RDX = 0xb;
        }
        lj_cconv_ct_ct(in_stack_ffffffffffffff60,d,
                       (CType *)CONCAT44(local_134,in_stack_ffffffffffffff50),(uint8_t *)d,
                       (uint8_t *)CONCAT44(local_134,in_stack_ffffffffffffff40),
                       (CTInfo)((ulong)pCVar6 >> 0x20));
        return CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
      }
      if ((*(int *)(lVar2 + -4) != -5) ||
         (iVar1 = lj_strscan_num((GCstr *)in_stack_fffffffffffffec0,
                                 (TValue *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
         iVar1 == 0)) goto LAB_0016e375;
    }
    return (ulong)(*pdVar3 + 6755399441055744.0) & 0xffffffff;
  }
LAB_0016e375:
  lj_err_argt(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
}

Assistant:

uint64_t lj_carith_check64(lua_State *L, int narg, CTypeID *id)
{
  TValue *o = L->base + narg-1;
  if (o >= L->top) {
  err:
    lj_err_argt(L, narg, LUA_TNUMBER);
  } else if (LJ_LIKELY(tvisnumber(o))) {
    /* Handled below. */
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(L);
    uint8_t *sp = (uint8_t *)cdataptr(cdataV(o));
    CTypeID sid = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, sid);
    uint64_t x;
    if (ctype_isref(s->info)) {
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isenum(s->info)) s = ctype_child(cts, s);
    if ((s->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && s->size == 8)
      *id = CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    else if (!*id)
      *id = CTID_INT64;  /* Use int64_t, unless already set. */
    lj_cconv_ct_ct(cts, ctype_get(cts, *id), s,
		   (uint8_t *)&x, sp, CCF_ARG(narg));
    return x;
  } else if (!(tvisstr(o) && lj_strscan_number(strV(o), o))) {
    goto err;
  }
  if (LJ_LIKELY(tvisint(o))) {
    return (uint32_t)intV(o);
  } else {
    return (uint32_t)lj_num2bit(numV(o));
  }
}